

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::MaxPlus_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  double dVar3;
  Arguments *theArgumentsStruc;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  switch(in_EDI) {
  case 1:
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x1e0) = (long)iVar2;
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::__cxx11::string::operator=((string *)(lVar1 + 0x1e8),(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator(&local_41);
    break;
  case 3:
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x1c8) = (long)iVar2;
    break;
  case 4:
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x1d0) = (long)iVar2;
    break;
  case 5:
    dVar3 = atof(in_RSI);
    *(double *)(lVar1 + 0x1d8) = dVar3;
    break;
  default:
    return 7;
  }
  return 0;
}

Assistant:

error_t
MaxPlus_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case MAXPLUS_RESTARTS:
        theArgumentsStruc->maxplus_nrRestarts =  atoi(arg);
        break;
    case MAXPLUS_UPDATE:
        theArgumentsStruc->maxplus_updateT =  std::string(arg);
        break;
    case MAXPLUS_ITER:
        theArgumentsStruc->maxplus_maxiter =  atoi(arg);
        break;
    case MAXPLUS_VERB:
        theArgumentsStruc->maxplus_verbose =  atoi(arg);
        break;
    case MAXPLUS_DAMP:
        theArgumentsStruc->maxplus_damping =  atof(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}